

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::free
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this,void *__ptr)

{
  __pointer_type pTVar1;
  __pointer_type pTVar2;
  bool bVar3;
  
  if (*(code **)((long)__ptr + 0x10) != (code *)0x0) {
    (**(code **)((long)__ptr + 0x10))(__ptr,__ptr,3);
  }
  pTVar1 = (this->head_)._M_b._M_p;
  do {
    *(__pointer_type *)((long)__ptr + 0x28) = pTVar1;
    LOCK();
    pTVar2 = (this->head_)._M_b._M_p;
    bVar3 = pTVar1 == pTVar2;
    if (bVar3) {
      (this->head_)._M_b._M_p =
           (__pointer_type)(((ulong)pTVar1 & 0xffff000000000000) + 0x1000000000000 | (ulong)__ptr);
      pTVar2 = pTVar1;
    }
    UNLOCK();
    pTVar1 = pTVar2;
  } while (!bVar3);
  return;
}

Assistant:

void free(T* const datain) noexcept(ALLOC_ONCE)
  {
    if (!ALLOC_ONCE) {
      datain->~T();
    }

    datain->next = head_.load(std::memory_order_relaxed);
    while(!head_.compare_exchange_weak(datain->next, next_ptr(datain, datain->next)));
  }